

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture_p.h
# Opt level: O0

void __thiscall QSwipeGesturePrivate::QSwipeGesturePrivate(QSwipeGesturePrivate *this)

{
  QGesturePrivate *pQVar1;
  QGesturePrivate *in_RDI;
  undefined1 *local_10;
  
  QGesturePrivate::QGesturePrivate(in_RDI);
  *(undefined ***)in_RDI = &PTR__QSwipeGesturePrivate_00d072e8;
  *(undefined4 *)&in_RDI->field_0xa4 = 0;
  *(undefined4 *)(in_RDI + 1) = 0;
  *(undefined8 *)&in_RDI[1].field_0x8 = 0;
  local_10 = &in_RDI[1].field_0x10;
  pQVar1 = in_RDI + 1;
  do {
    QPoint::QPoint((QPoint *)in_RDI);
    local_10 = local_10 + 8;
  } while (local_10 != &pQVar1->field_0x28);
  *(undefined4 *)&in_RDI[1].field_0x28 = 0;
  *(undefined8 *)&in_RDI[1].field_0x30 = 0;
  QElapsedTimer::QElapsedTimer((QElapsedTimer *)&in_RDI[1].field_0x38);
  return;
}

Assistant:

QSwipeGesturePrivate()
        : horizontalDirection(QSwipeGesture::NoDirection),
          verticalDirection(QSwipeGesture::NoDirection),
          swipeAngle(0),
          state(NoGesture), velocityValue(0)
    {
    }